

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O2

void __thiscall spdlog::pattern_formatter::~pattern_formatter(pattern_formatter *this)

{
  std::
  vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
  ::~vector(&this->_formatters);
  std::__cxx11::string::~string((string *)&this->_pattern);
  std::__cxx11::string::~string((string *)&this->_eol);
  return;
}

Assistant:

class pattern_formatter SPDLOG_FINAL : public formatter
{
public:
    explicit pattern_formatter(const std::string &pattern, pattern_time_type pattern_time = pattern_time_type::local,
        std::string eol = spdlog::details::os::default_eol);
    pattern_formatter(const pattern_formatter &) = delete;
    pattern_formatter &operator=(const pattern_formatter &) = delete;
    void format(details::log_msg &msg) override;

private:
    const std::string _eol;
    const std::string _pattern;
    const pattern_time_type _pattern_time;
    std::vector<std::unique_ptr<details::flag_formatter>> _formatters;
    std::tm get_time(details::log_msg &msg);
    void handle_flag(char flag);
    void compile_pattern(const std::string &pattern);
}